

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

ZSTD_CDict *
duckdb_zstd::ZSTD_createCDict_advanced2
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_CCtx_params *originalCctxParams,
          ZSTD_customMem customMem)

{
  ZSTD_CDict *pZVar1;
  ZSTD_strategy ZVar2;
  size_t sVar3;
  ZSTD_CDict *cdict;
  ZSTD_CCtx_params *pZVar4;
  undefined8 *puVar5;
  ZSTD_paramSwitch_e useRowMatchFinder;
  long lVar6;
  size_t __size;
  void *pvVar7;
  byte bVar8;
  ulong uVar9;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params in_stack_fffffffffffffdd8;
  ZSTD_compressionParameters local_138;
  ZSTD_freeFunction local_110;
  ZSTD_CCtx_params local_108;
  
  bVar8 = 0;
  switchD_012dd528::default(&local_108,originalCctxParams,0xd8);
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    if (local_108.enableDedicatedDictSearch == 0) {
      ZSTD_getCParamsFromCCtxParams
                (&local_138,&local_108,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      uVar9 = CONCAT44(local_138.targetLength,local_138.minMatch);
      ZVar2 = local_138.strategy;
      local_108.cParams.windowLog = local_138.windowLog;
      local_108.cParams.chainLog = local_138.chainLog;
      local_108.cParams.hashLog = local_138.hashLog;
      local_108.cParams.searchLog = local_138.searchLog;
    }
    else {
      ZSTD_getCParams_internal
                (&local_138,local_108.compressionLevel,0,dictSize,ZSTD_cpm_createCDict);
      if (local_138.strategy - ZSTD_greedy < 3) {
        local_138.hashLog = local_138.hashLog + 2;
      }
      local_108.cParams.windowLog =
           ~-(uint)(local_108.cParams.windowLog == 0) & local_108.cParams.windowLog |
           local_138.windowLog & -(uint)(local_108.cParams.windowLog == 0);
      local_108.cParams.chainLog =
           ~-(uint)(local_108.cParams.chainLog == 0) & local_108.cParams.chainLog |
           local_138.chainLog & -(uint)(local_108.cParams.chainLog == 0);
      local_108.cParams.hashLog =
           ~-(uint)(local_108.cParams.hashLog == 0) & local_108.cParams.hashLog |
           local_138.hashLog & -(uint)(local_108.cParams.hashLog == 0);
      local_108.cParams.searchLog =
           ~-(uint)(local_108.cParams.searchLog == 0) & local_108.cParams.searchLog |
           local_138.searchLog & -(uint)(local_108.cParams.searchLog == 0);
      uVar9 = CONCAT44(-(uint)(local_108.cParams.targetLength == 0),
                       -(uint)(local_108.cParams.minMatch == 0));
      uVar9 = ~uVar9 & CONCAT44(local_108.cParams.targetLength,local_108.cParams.minMatch) |
              CONCAT44(local_138.targetLength,local_138.minMatch) & uVar9;
      ZVar2 = local_138.strategy;
      if (local_108.cParams.strategy != 0) {
        ZVar2 = local_108.cParams.strategy;
      }
    }
    local_110 = customMem.customFree;
    if (((ZVar2 - ZSTD_btlazy2 < 0xfffffffd) ||
        (local_108.cParams.hashLog <= local_108.cParams.chainLog)) ||
       (0x18 < local_108.cParams.chainLog)) {
      local_108.enableDedicatedDictSearch = 0;
      ZSTD_getCParamsFromCCtxParams
                (&local_138,&local_108,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      uVar9 = CONCAT44(local_138.targetLength,local_138.minMatch);
      ZVar2 = local_138.strategy;
      local_108.cParams.windowLog = local_138.windowLog;
      local_108.cParams.chainLog = local_138.chainLog;
      local_108.cParams.hashLog = local_138.hashLog;
      local_108.cParams.searchLog = local_138.searchLog;
    }
    local_108.cParams.minMatch = (uint)uVar9;
    local_108.cParams.targetLength = (uint)(uVar9 >> 0x20);
    useRowMatchFinder = local_108.useRowMatchFinder;
    if ((local_108.useRowMatchFinder == ZSTD_ps_auto) &&
       (useRowMatchFinder = ZSTD_ps_disable, 0xfffffffc < ZVar2 - ZSTD_btlazy2)) {
      useRowMatchFinder = (local_108.cParams.windowLog < 0xf) + ZSTD_ps_enable;
    }
    local_138.chainLog = local_108.cParams.chainLog;
    local_138.windowLog = local_108.cParams.windowLog;
    local_138.minMatch = local_108.cParams.minMatch;
    local_138.targetLength = local_108.cParams.targetLength;
    local_138.hashLog = local_108.cParams.hashLog;
    local_138.searchLog = local_108.cParams.searchLog;
    local_108.useRowMatchFinder = useRowMatchFinder;
    sVar3 = ZSTD_sizeof_matchState
                      (&local_138,useRowMatchFinder,local_108.enableDedicatedDictSearch,0);
    lVar6 = (dictSize + 7 & 0xfffffffffffffff8) + 0x39c0;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      lVar6 = 0x39c0;
    }
    __size = lVar6 + sVar3;
    if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
      cdict = (ZSTD_CDict *)malloc(__size);
    }
    else {
      cdict = (ZSTD_CDict *)(*customMem.customAlloc)(customMem.opaque,__size);
    }
    if (cdict == (ZSTD_CDict *)0x0) {
      cdict = (ZSTD_CDict *)0x0;
    }
    else {
      pvVar7 = (void *)((long)&cdict->dictContent + __size);
      pZVar1 = cdict + 1;
      (cdict->workspace).workspace = cdict;
      (cdict->workspace).workspaceEnd = pvVar7;
      pvVar7 = (void *)((ulong)pvVar7 & 0xffffffffffffffc0);
      (cdict->workspace).objectEnd = pZVar1;
      (cdict->workspace).tableEnd = pZVar1;
      (cdict->workspace).tableValidEnd = pZVar1;
      (cdict->workspace).allocStart = pvVar7;
      (cdict->workspace).initOnceStart = pvVar7;
      (cdict->workspace).allocFailed = '\0';
      (cdict->workspace).workspaceOversizedDuration = 0;
      (cdict->workspace).phase = ZSTD_cwksp_alloc_objects;
      (cdict->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
      (cdict->customMem).customAlloc = customMem.customAlloc;
      (cdict->customMem).customFree = local_110;
      (cdict->customMem).opaque = customMem.opaque;
      cdict->compressionLevel = 0;
      cdict->useRowMatchFinder = useRowMatchFinder;
    }
    if (cdict != (ZSTD_CDict *)0x0) {
      pZVar4 = &local_108;
      puVar5 = (undefined8 *)&stack0xfffffffffffffdd8;
      for (lVar6 = 0x1b; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar5 = *(undefined8 *)pZVar4;
        pZVar4 = (ZSTD_CCtx_params *)((long)pZVar4 + ((ulong)bVar8 * -2 + 1) * 8);
        puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      }
      sVar3 = ZSTD_initCDict_internal
                        (cdict,dict,dictSize,dictLoadMethod,dictContentType,
                         in_stack_fffffffffffffdd8);
      if (sVar3 < 0xffffffffffffff89) {
        return cdict;
      }
    }
    ZSTD_freeCDict(cdict);
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced2(
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType,
        const ZSTD_CCtx_params* originalCctxParams,
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams = *originalCctxParams;
    ZSTD_compressionParameters cParams;
    ZSTD_CDict* cdict;

    DEBUGLOG(3, "ZSTD_createCDict_advanced2, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    if (cctxParams.enableDedicatedDictSearch) {
        cParams = ZSTD_dedicatedDictSearch_getCParams(
            cctxParams.compressionLevel, dictSize);
        ZSTD_overrideCParams(&cParams, &cctxParams.cParams);
    } else {
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    if (!ZSTD_dedicatedDictSearch_isSupported(&cParams)) {
        /* Fall back to non-DDSS params */
        cctxParams.enableDedicatedDictSearch = 0;
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    DEBUGLOG(3, "ZSTD_createCDict_advanced2: DDS: %u", cctxParams.enableDedicatedDictSearch);
    cctxParams.cParams = cParams;
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);

    cdict = ZSTD_createCDict_advanced_internal(dictSize,
                        dictLoadMethod, cctxParams.cParams,
                        cctxParams.useRowMatchFinder, cctxParams.enableDedicatedDictSearch,
                        customMem);

    if (!cdict || ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                    dict, dictSize,
                                    dictLoadMethod, dictContentType,
                                    cctxParams) )) {
        ZSTD_freeCDict(cdict);
        return NULL;
    }

    return cdict;
}